

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::MakeFn(VirtualMachine *this)

{
  element_type *peVar1;
  pointer pCVar2;
  pointer pCVar3;
  element_type *peVar4;
  size_t __n;
  Function *fn;
  const_reference pvVar5;
  ClosureContext *closure;
  pointer closure_00;
  string local_58;
  allocator<char> local_31;
  
  __n = getByteCodeParameter(this);
  peVar1 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (__n < (ulong)((long)(peVar1->functions).
                          super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar1->functions).
                          super__Vector_base<bytecode::Function,_std::allocator<bytecode::Function>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6)) {
    fn = Heap::NewFunction(&this->heap);
    pvVar5 = std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::at
                       (&((this->file).
                          super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->functions,__n);
    fn->fn = pvVar5;
    pCVar2 = (fn->captures).
             super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((fn->captures).
        super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>.
        _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
      (fn->captures).
      super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar2;
    }
    pCVar3 = (pvVar5->closures).
             super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (closure_00 = (pvVar5->closures).
                      super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                      ._M_impl.super__Vector_impl_data._M_start; closure_00 != pCVar3;
        closure_00 = closure_00 + 1) {
      local_58._0_16_ = loadClosure(this,closure_00);
      std::vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>::
      emplace_back<runtime::ClosureContext>(&fn->captures,(ClosureContext *)&local_58);
    }
    std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(fn->scopeOuter).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>
               ,&(this->stackFrame).
                 super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>);
    pushFunction(this,fn);
    peVar4 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar4->programCounter = peVar4->programCounter + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Index out of bounds in MakeFn",&local_31);
  panic(this,&local_58);
}

Assistant:

void runtime::VirtualMachine::MakeFn() {
  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->functions.size()) {
    this->panic("Index out of bounds in MakeFn");
    return;
  }

  runtime::Function* fn = this->heap.NewFunction();
  fn->fn = &this->file->functions.at(index);
  fn->captures.clear();

  for (const auto& closure : fn->fn->closures) {
    fn->captures.push_back(this->loadClosure(closure));
  }

  fn->scopeOuter = this->stackFrame;

  this->pushFunction(fn);

  this->advance();
}